

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O2

void __thiscall
BlindFactor_Constractor_hex_empty_Test::TestBody(BlindFactor_Constractor_hex_empty_Test *this)

{
  bool bVar1;
  allocator local_51;
  AssertHelper local_50 [4];
  BlindFactor blind_factor;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)local_50,"",&local_51);
    cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  }
  testing::Message::Message((Message *)&blind_factor);
  testing::internal::AssertHelper::AssertHelper
            (local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x1c,
             "Expected: BlindFactor blind_factor(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_50,(Message *)&blind_factor);
  testing::internal::AssertHelper::~AssertHelper(local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&blind_factor);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_hex_empty) {
  EXPECT_THROW(BlindFactor blind_factor(""), CfdException);
}